

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O0

void __thiscall Assimp::X3DImporter::ParseNode_Head(X3DImporter *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  pointer pFVar4;
  CX3DImporter_NodeElement_MetaString *this_00;
  undefined4 extraout_var;
  ulong uVar5;
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  undefined4 extraout_var_00;
  allocator<char> local_d9;
  string local_d8;
  allocator<char> local_b1;
  string local_b0;
  CX3DImporter_NodeElement_MetaString *local_90;
  CX3DImporter_NodeElement_MetaString *local_88;
  allocator<char> local_79;
  value_type local_78;
  CX3DImporter_NodeElement_MetaString *local_58;
  CX3DImporter_NodeElement_MetaString *ms;
  bool added;
  allocator<char> local_39;
  string local_38;
  byte local_11;
  X3DImporter *pXStack_10;
  bool close_found;
  X3DImporter *this_local;
  
  local_11 = 0;
  pXStack_10 = this;
  do {
    do {
      while( true ) {
        pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        uVar2 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[2])();
        if ((uVar2 & 1) == 0) goto LAB_00a91e03;
        pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                 operator->(&this->mReader);
        iVar3 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
        if (iVar3 != 1) break;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"meta",&local_39);
        bVar1 = XML_CheckNode_NameEqual(this,&local_38);
        std::__cxx11::string::~string((string *)&local_38);
        std::allocator<char>::~allocator(&local_39);
        if (bVar1) {
          XML_CheckNode_MustBeEmpty(this);
          ms._3_1_ = 0;
          this_00 = (CX3DImporter_NodeElement_MetaString *)operator_new(0xa8);
          CX3DImporter_NodeElement_MetaString::CX3DImporter_NodeElement_MetaString
                    (this_00,this->NodeElement_Cur);
          local_58 = this_00;
          pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                   operator->(&this->mReader);
          iVar3 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[8])
                            (pFVar4,"name");
          std::__cxx11::string::operator=
                    ((string *)&(local_58->super_CX3DImporter_NodeElement_Meta).Name,
                     (char *)CONCAT44(extraout_var,iVar3));
          uVar5 = std::__cxx11::string::empty();
          if ((uVar5 & 1) == 0) {
            this_01 = &local_58->Value;
            pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::
                     operator->(&this->mReader);
            iVar3 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[8])
                              (pFVar4,"content");
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_78,(char *)CONCAT44(extraout_var_00,iVar3),&local_79);
            std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::push_back(this_01,&local_78);
            std::__cxx11::string::~string((string *)&local_78);
            std::allocator<char>::~allocator(&local_79);
            local_88 = local_58;
            std::__cxx11::
            list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::push_back
                      (&this->NodeElement_List,(value_type *)&local_88);
            if (this->NodeElement_Cur != (CX3DImporter_NodeElement *)0x0) {
              local_90 = local_58;
              std::__cxx11::
              list<CX3DImporter_NodeElement_*,_std::allocator<CX3DImporter_NodeElement_*>_>::
              push_back(&this->NodeElement_Cur->Child,(value_type *)&local_90);
              ms._3_1_ = 1;
            }
          }
          if (((ms._3_1_ & 1) == 0) && (local_58 != (CX3DImporter_NodeElement_MetaString *)0x0)) {
            (*(local_58->super_CX3DImporter_NodeElement_Meta).super_CX3DImporter_NodeElement.
              _vptr_CX3DImporter_NodeElement[1])();
          }
        }
      }
      pFVar4 = std::unique_ptr<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>::operator->
                         (&this->mReader);
      iVar3 = (*(pFVar4->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[3])();
    } while (iVar3 != 2);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"head",&local_b1);
    bVar1 = XML_CheckNode_NameEqual(this,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
  } while (!bVar1);
  local_11 = 1;
LAB_00a91e03:
  if ((local_11 & 1) == 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"head",&local_d9);
    Throw_CloseNotFound(this,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::allocator<char>::~allocator(&local_d9);
  }
  return;
}

Assistant:

void X3DImporter::ParseNode_Head()
{
    bool close_found = false;// flag: true if close tag of node are found.

	while(mReader->read())
	{
		if(mReader->getNodeType() == irr::io::EXN_ELEMENT)
		{
			if(XML_CheckNode_NameEqual("meta"))
			{
				XML_CheckNode_MustBeEmpty();

				// adding metadata from <head> as MetaString from <Scene>
                bool added( false );
                CX3DImporter_NodeElement_MetaString* ms = new CX3DImporter_NodeElement_MetaString(NodeElement_Cur);

				ms->Name = mReader->getAttributeValueSafe("name");
				// name must not be empty
				if(!ms->Name.empty())
				{
					ms->Value.push_back(mReader->getAttributeValueSafe("content"));
					NodeElement_List.push_back(ms);
                    if ( NodeElement_Cur != nullptr )
                    {
                        NodeElement_Cur->Child.push_back( ms );
                        added = true;
                    }
				}
                // if an error has occurred, release instance
                if ( !added ) {
                    delete ms;
                }
			}// if(XML_CheckNode_NameEqual("meta"))
		}// if(mReader->getNodeType() == irr::io::EXN_ELEMENT)
		else if(mReader->getNodeType() == irr::io::EXN_ELEMENT_END)
		{
			if(XML_CheckNode_NameEqual("head"))
			{
				close_found = true;
				break;
			}
		}// if(mReader->getNodeType() == irr::io::EXN_ELEMENT) else
	}// while(mReader->read())

    if ( !close_found )
    {
        Throw_CloseNotFound( "head" );
    }
}